

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

void __thiscall
QColorDialogPrivate::updateColorLabelText(QColorDialogPrivate *this,QPoint *globalPos)

{
  QLabel *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->lblScreenColorInfo;
  if (this_00 != (QLabel *)0x0) {
    QColorDialog::tr((QString *)&local_80,"Cursor at %1, %2\nPress ESC to cancel",(char *)0x0,-1);
    QString::arg<int,_true>
              ((QString *)&local_68,(QString *)&local_80,(globalPos->xp).m_i,0,10,(QChar)0x20);
    QString::arg<int,_true>
              ((QString *)&local_50,(QString *)&local_68,(globalPos->yp).m_i,0,10,(QChar)0x20);
    QLabel::setText(this_00,(QString *)&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorDialogPrivate::updateColorLabelText(const QPoint &globalPos)
{
    if (lblScreenColorInfo)
        lblScreenColorInfo->setText(QColorDialog::tr("Cursor at %1, %2\nPress ESC to cancel")
                                .arg(globalPos.x())
                                .arg(globalPos.y()));
}